

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *
unodb::detail::
obsolete<unodb::detail::olc_inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *t,
          write_guard *guard)

{
  optimistic_lock *this;
  pthread_t pVar1;
  
  this = guard->lock;
  if (this == (optimistic_lock *)t) {
    optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&this->version);
    pVar1 = pthread_self();
    (this->obsoleter_thread)._M_thread = pVar1;
    guard->lock = (optimistic_lock *)0x0;
    return t;
  }
  __assert_fail("guard.guards(lock(t))",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x3e5,
                "T &unodb::detail::obsolete(T &, unodb::optimistic_lock::write_guard &) [T = unodb::detail::olc_inode_256<unsigned long, std::span<const std::byte>>]"
               );
}

Assistant:

[[nodiscard]] T& obsolete(T& t UNODB_DETAIL_LIFETIMEBOUND,
                          unodb::optimistic_lock::write_guard& guard) noexcept {
  UNODB_DETAIL_ASSERT(guard.guards(lock(t)));

  // My first attempt was to pass guard by value and let it destruct at the end
  // of this scope, but due to copy elision (?) the destructor got called way
  // too late, after the owner node was destructed.
  guard.unlock_and_obsolete();

  return t;
}